

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  int *piVar29;
  long lVar30;
  ulong uVar31;
  uint8_t uVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  ulong local_138;
  ulong local_130;
  int local_124;
  ulong local_120;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  size_t *local_e8;
  ulong local_d8;
  ulong auStack_58 [5];
  
  local_120 = *(ulong *)dist_cache;
  uVar26 = position + num_bytes;
  uVar11 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    uVar11 = position;
  }
  lVar35 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar35 = 0x40;
  }
  if (uVar26 <= position + 8) {
    local_e8 = last_insert_len;
LAB_00103f7d:
    *(ulong *)dist_cache = (local_120 + uVar26) - position;
    *(long *)commands = *(long *)commands + ((long)local_e8 - (long)last_insert_len >> 4);
    return;
  }
  uVar28 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  lVar4 = *(long *)(literal_context_lut + 0x10);
  local_d8 = lVar35 + position;
  lVar5 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar8 = (uint)ringbuffer_mask;
  uVar1 = uVar26 - 7;
  lVar3 = position - 1;
  local_e8 = last_insert_len;
  uVar15 = position;
LAB_00103074:
  local_110 = uVar26 - uVar15;
  uVar12 = uVar28;
  if (uVar15 < uVar28) {
    uVar12 = uVar15;
  }
  uVar31 = lVar4 + uVar15;
  if (uVar28 <= lVar4 + uVar15) {
    uVar31 = uVar28;
  }
  uVar36 = uVar15 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar36);
  uVar32 = ringbuffer[uVar36];
  local_108 = (ulong)*(int *)&(hasher->common).extra;
  local_130 = 0x7e4;
  if ((uVar15 - local_108 < uVar15) &&
     (uVar19 = (ulong)((uint)(uVar15 - local_108) & uVar8), uVar32 == ringbuffer[uVar19])) {
    if (7 < local_110) {
      uVar17 = local_110 & 0xfffffffffffffff8;
      piVar29 = (int *)(ringbuffer + uVar17 + uVar36);
      lVar18 = 0;
      uVar38 = 0;
LAB_0010310f:
      if (*(ulong *)(piVar2 + uVar38 * 2) == *(ulong *)(ringbuffer + uVar38 * 8 + uVar19))
      goto code_r0x0010311c;
      uVar17 = *(ulong *)(ringbuffer + uVar38 * 8 + uVar19) ^ *(ulong *)(piVar2 + uVar38 * 2);
      uVar19 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      local_138 = (uVar19 >> 3 & 0x1fffffff) - lVar18;
      goto LAB_0010314d;
    }
    uVar17 = 0;
    piVar29 = piVar2;
LAB_00103f09:
    uVar38 = local_110 & 7;
    local_138 = uVar17;
    if (uVar38 != 0) {
      uVar23 = uVar17 | uVar38;
      do {
        local_138 = uVar17;
        if (ringbuffer[uVar17 + uVar19] != (uint8_t)*piVar29) break;
        piVar29 = (int *)((long)piVar29 + 1);
        uVar17 = uVar17 + 1;
        uVar38 = uVar38 - 1;
        local_138 = uVar23;
      } while (uVar38 != 0);
    }
LAB_0010314d:
    if ((local_138 < 4) || (uVar19 = local_138 * 0x87 + 0x78f, uVar19 < 0x7e5)) goto LAB_00103175;
    uVar32 = *(uint8_t *)((long)piVar2 + local_138);
    local_130 = uVar19;
  }
  else {
LAB_00103175:
    local_108 = 0;
    local_138 = 0;
  }
  uVar19 = *(ulong *)(literal_context_lut + 0x50);
  lVar18 = *(long *)(ringbuffer + uVar36);
  lVar30 = 0;
  do {
    *(ulong *)((long)auStack_58 + lVar30) =
         (ulong)((uint)((ulong)(lVar18 * -0x42e1ca5843000000) >> 0x2f) + (int)lVar30 & 0x1ffff);
    lVar30 = lVar30 + 8;
  } while (lVar30 != 0x20);
  lVar18 = *(long *)((long)auStack_58 + (ulong)((uint)uVar15 & 0x18));
  uVar17 = (ulong)((uint)local_110 & 7);
  lVar30 = 0;
  do {
    uVar37 = *(uint *)(lVar5 + auStack_58[lVar30] * 4);
    uVar27 = uVar8 & uVar37;
    if (((uVar32 == ringbuffer[local_138 + uVar27]) && (uVar15 != uVar37)) &&
       (uVar38 = uVar15 - uVar37, uVar38 <= uVar12)) {
      if (7 < local_110) {
        lVar20 = 0;
        uVar23 = 0;
LAB_00103253:
        if (*(ulong *)(piVar2 + uVar23 * 2) == *(ulong *)(ringbuffer + uVar23 * 8 + (ulong)uVar27))
        goto code_r0x00103260;
        uVar40 = *(ulong *)(ringbuffer + uVar23 * 8 + (ulong)uVar27) ^
                 *(ulong *)(piVar2 + uVar23 * 2);
        uVar23 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        uVar23 = (uVar23 >> 3 & 0x1fffffff) - lVar20;
        goto LAB_0010329a;
      }
      piVar29 = piVar2;
      uVar40 = 0;
LAB_001032e5:
      uVar23 = uVar40;
      if (uVar17 != 0) {
        uVar34 = uVar17 | uVar40;
        uVar39 = uVar17;
        do {
          uVar23 = uVar40;
          if (ringbuffer[uVar40 + uVar27] != (uint8_t)*piVar29) break;
          piVar29 = (int *)((long)piVar29 + 1);
          uVar40 = uVar40 + 1;
          uVar39 = uVar39 - 1;
          uVar23 = uVar34;
        } while (uVar39 != 0);
      }
LAB_0010329a:
      if (3 < uVar23) {
        iVar25 = 0x1f;
        if ((uint)uVar38 != 0) {
          for (; (uint)uVar38 >> iVar25 == 0; iVar25 = iVar25 + -1) {
          }
        }
        uVar40 = (ulong)(iVar25 * -0x1e + 0x780) + uVar23 * 0x87;
        if (local_130 < uVar40) {
          uVar32 = *(uint8_t *)((long)piVar2 + uVar23);
          local_138 = uVar23;
          local_130 = uVar40;
          local_108 = uVar38;
        }
      }
    }
    lVar30 = lVar30 + 1;
  } while (lVar30 != 4);
  local_124 = 0;
  if ((local_130 == 0x7e4) &&
     (lVar30 = *(long *)&(params->hasher).block_bits,
     *(ulong *)(lVar30 + 8) >> 7 <= *(ulong *)(lVar30 + 0x10))) {
    iVar25 = *piVar2;
    lVar20 = *(long *)(literal_context_lut + 0x78);
    *(long *)(lVar30 + 8) = *(long *)(lVar30 + 8) + 1;
    uVar12 = (ulong)((uint)(iVar25 * 0x1e35a7bd) >> 0x12);
    bVar16 = *(byte *)(lVar20 + uVar12 * 2);
    uVar36 = (ulong)bVar16;
    if (uVar36 == 0) goto LAB_0010340c;
    bVar41 = true;
    local_124 = 0;
    if (uVar36 <= local_110) {
      uVar12 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar12 * 4);
      lVar20 = *(long *)(literal_context_lut + 0x58);
      pcVar14 = (char *)(uVar12 * uVar36 + *(long *)(lVar20 + 0xa8) +
                        (ulong)*(uint *)(lVar20 + 0x20 + uVar36 * 4));
      if (7 < bVar16) {
        uVar17 = (ulong)(bVar16 & 0xfffffff8);
        lVar22 = 0;
        uVar38 = 0;
LAB_00103adb:
        if (*(ulong *)(pcVar14 + uVar38 * 8) == *(ulong *)(piVar2 + uVar38 * 2))
        goto code_r0x00103ae8;
        uVar38 = *(ulong *)(piVar2 + uVar38 * 2) ^ *(ulong *)(pcVar14 + uVar38 * 8);
        uVar17 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        uVar38 = (uVar17 >> 3 & 0x1fffffff) - lVar22;
        goto LAB_00103b23;
      }
      uVar17 = 0;
      goto LAB_00103f39;
    }
    goto LAB_001033a6;
  }
  goto LAB_0010340c;
code_r0x0010311c:
  uVar38 = uVar38 + 1;
  lVar18 = lVar18 + -8;
  if (local_110 >> 3 == uVar38) goto LAB_00103f09;
  goto LAB_0010310f;
code_r0x00103260:
  uVar23 = uVar23 + 1;
  lVar20 = lVar20 + -8;
  piVar29 = (int *)(ringbuffer + (local_110 & 0xfffffffffffffff8) + uVar36);
  uVar40 = local_110 & 0xfffffffffffffff8;
  if (local_110 >> 3 == uVar23) goto LAB_001032e5;
  goto LAB_00103253;
code_r0x00103ae8:
  uVar38 = uVar38 + 1;
  lVar22 = lVar22 + -8;
  if (bVar16 >> 3 == uVar38) goto code_r0x00103af4;
  goto LAB_00103adb;
code_r0x00103af4:
  pcVar14 = pcVar14 + -lVar22;
LAB_00103f39:
  uVar23 = uVar36 & 7;
  uVar38 = uVar17;
  if ((bVar16 & 7) != 0) {
    uVar40 = uVar17 | uVar23;
    do {
      uVar38 = uVar17;
      if (*(char *)((long)piVar2 + uVar17) != *pcVar14) break;
      pcVar14 = pcVar14 + 1;
      uVar17 = uVar17 + 1;
      uVar23 = uVar23 - 1;
      uVar38 = uVar40;
    } while (uVar23 != 0);
  }
LAB_00103b23:
  if (((uVar38 != 0) && (uVar36 < *(uint *)(literal_context_lut + 100) + uVar38)) &&
     (uVar12 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar36 - uVar38) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar36 - uVar38) * 4 << (*(byte *)(lVar20 + uVar36) & 0x3f)) + uVar31 + 1 + uVar12,
     uVar12 <= uVar19)) {
    iVar25 = 0x1f;
    if ((uint)uVar12 != 0) {
      for (; (uint)uVar12 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    uVar31 = (uVar38 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
    if (0x7e3 < uVar31) {
      local_124 = (uint)bVar16 - (int)uVar38;
      bVar41 = false;
      local_130 = uVar31;
      local_138 = uVar38;
      local_108 = uVar12;
    }
  }
LAB_001033a6:
  if (!bVar41) {
    *(long *)(lVar30 + 0x10) = *(long *)(lVar30 + 0x10) + 1;
  }
LAB_0010340c:
  *(uint *)(lVar5 + lVar18 * 4) = (uint)uVar15;
  if (0x7e4 < local_130) {
    uVar12 = (ulong)*(int *)&(hasher->common).extra;
    uVar31 = (lVar3 + num_bytes) - uVar15;
    iVar25 = 0;
LAB_00103435:
    local_110 = local_110 - 1;
    uVar36 = local_138 - 1;
    if (local_110 <= local_138 - 1) {
      uVar36 = local_110;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar36 = 0;
    }
    uVar17 = uVar15 + 1;
    uVar38 = uVar28;
    if (uVar17 < uVar28) {
      uVar38 = uVar17;
    }
    uVar23 = lVar4 + uVar15 + 1;
    if (uVar28 <= uVar23) {
      uVar23 = uVar28;
    }
    piVar2 = (int *)(ringbuffer + (uVar17 & ringbuffer_mask));
    uVar32 = *(uint8_t *)(uVar36 + (long)piVar2);
    uVar39 = uVar17 - uVar12;
    uVar40 = 0x7e4;
    if ((uVar39 < uVar17) && (uVar37 = (uint)uVar39 & uVar8, uVar32 == ringbuffer[uVar36 + uVar37]))
    {
      if (7 < local_110) {
        lVar18 = 0;
        uVar39 = 0;
LAB_001034e9:
        if (*(ulong *)(piVar2 + uVar39 * 2) == *(ulong *)(ringbuffer + uVar39 * 8 + (ulong)uVar37))
        goto code_r0x001034f6;
        uVar34 = *(ulong *)(ringbuffer + uVar39 * 8 + (ulong)uVar37) ^
                 *(ulong *)(piVar2 + uVar39 * 2);
        uVar39 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
          }
        }
        local_f8 = (uVar39 >> 3 & 0x1fffffff) - lVar18;
        goto LAB_00103529;
      }
      local_f8 = 0;
      piVar29 = piVar2;
      goto LAB_0010391a;
    }
    goto LAB_00103568;
  }
  local_120 = local_120 + 1;
  position = uVar15 + 1;
  if ((num_literals == (size_t *)0x0) && (local_d8 < position)) {
    if ((uint)((int)lVar35 * 4) + local_d8 < position) {
      uVar12 = uVar15 + 0x11;
      if (uVar1 <= uVar15 + 0x11) {
        uVar12 = uVar1;
      }
      for (; position < uVar12; position = position + 4) {
        *(uint *)(lVar5 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x42e1ca5843000000) >> 0x2f) +
                                  ((uint)position & 0x18) & 0x1ffff) * 4) = (uint)position;
        local_120 = local_120 + 4;
      }
    }
    else {
      uVar12 = uVar15 + 9;
      if (uVar1 <= uVar15 + 9) {
        uVar12 = uVar1;
      }
      for (; position < uVar12; position = position + 2) {
        *(uint *)(lVar5 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x42e1ca5843000000) >> 0x2f) +
                                  ((uint)position & 0x18) & 0x1ffff) * 4) = (uint)position;
        local_120 = local_120 + 2;
      }
    }
  }
  goto LAB_00103eb3;
code_r0x001034f6:
  uVar39 = uVar39 + 1;
  lVar18 = lVar18 + -8;
  if (uVar31 >> 3 == uVar39) goto code_r0x00103504;
  goto LAB_001034e9;
code_r0x00103504:
  local_f8 = -lVar18;
  piVar29 = (int *)((long)piVar2 - lVar18);
LAB_0010391a:
  uVar39 = local_110 & 7;
  for (; (uVar39 != 0 && (ringbuffer[local_f8 + uVar37] == (uint8_t)*piVar29));
      local_f8 = local_f8 + 1) {
    piVar29 = (int *)((long)piVar29 + 1);
    uVar39 = uVar39 - 1;
  }
LAB_00103529:
  if (local_f8 < 4) {
LAB_00103568:
    local_100 = 0;
    local_f8 = 0;
  }
  else {
    uVar39 = local_f8 * 0x87 + 0x78f;
    if (uVar39 < 0x7e5) {
      local_100 = 0;
      local_f8 = 0;
    }
    else {
      uVar32 = *(uint8_t *)((long)piVar2 + local_f8);
      uVar40 = uVar39;
      uVar36 = local_f8;
      local_100 = uVar12;
    }
  }
  lVar18 = *(long *)(ringbuffer + (uVar17 & ringbuffer_mask));
  lVar30 = 0;
  do {
    *(ulong *)((long)auStack_58 + lVar30) =
         (ulong)((uint)((ulong)(lVar18 * -0x42e1ca5843000000) >> 0x2f) + (int)lVar30 & 0x1ffff);
    lVar30 = lVar30 + 8;
  } while (lVar30 != 0x20);
  lVar18 = *(long *)((long)auStack_58 + (ulong)((uint)uVar17 & 0x18));
  uVar39 = (ulong)((uint)local_110 & 7);
  lVar30 = 0;
LAB_001035d7:
  uVar37 = *(uint *)(lVar5 + auStack_58[lVar30] * 4);
  uVar27 = uVar8 & uVar37;
  if (((uVar32 == ringbuffer[uVar36 + uVar27]) && (uVar17 != uVar37)) &&
     (uVar34 = uVar17 - uVar37, uVar34 <= uVar38)) {
    uVar13 = uVar39;
    if (7 < local_110) {
      lVar20 = 0;
      uVar21 = 0;
LAB_00103620:
      if (*(ulong *)(piVar2 + uVar21 * 2) == *(ulong *)(ringbuffer + uVar21 * 8 + (ulong)uVar27))
      goto code_r0x0010362d;
      uVar21 = *(ulong *)(ringbuffer + uVar21 * 8 + (ulong)uVar27) ^ *(ulong *)(piVar2 + uVar21 * 2)
      ;
      uVar13 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      uVar21 = (uVar13 >> 3 & 0x1fffffff) - lVar20;
      goto LAB_00103657;
    }
    uVar21 = 0;
    piVar29 = piVar2;
    goto joined_r0x001036b5;
  }
  goto LAB_00103698;
code_r0x0010362d:
  uVar21 = uVar21 + 1;
  lVar20 = lVar20 + -8;
  if (uVar31 >> 3 == uVar21) goto code_r0x0010363b;
  goto LAB_00103620;
code_r0x0010363b:
  uVar21 = -lVar20;
  piVar29 = (int *)((long)piVar2 - lVar20);
joined_r0x001036b5:
  for (; (uVar13 != 0 && (ringbuffer[uVar21 + uVar27] == (uint8_t)*piVar29)); uVar21 = uVar21 + 1) {
    uVar13 = uVar13 - 1;
    piVar29 = (int *)((long)piVar29 + 1);
  }
LAB_00103657:
  if (3 < uVar21) {
    iVar33 = 0x1f;
    if ((uint)uVar34 != 0) {
      for (; (uint)uVar34 >> iVar33 == 0; iVar33 = iVar33 + -1) {
      }
    }
    uVar13 = (ulong)(iVar33 * -0x1e + 0x780) + uVar21 * 0x87;
    if (uVar40 < uVar13) {
      uVar32 = *(uint8_t *)((long)piVar2 + uVar21);
      uVar40 = uVar13;
      uVar36 = uVar21;
      local_100 = uVar34;
      local_f8 = uVar21;
    }
  }
LAB_00103698:
  lVar30 = lVar30 + 1;
  if (lVar30 == 4) goto LAB_001036cd;
  goto LAB_001035d7;
LAB_001036cd:
  iVar33 = 0;
  if ((uVar40 != 0x7e4) ||
     (lVar30 = *(long *)&(params->hasher).block_bits, iVar33 = 0,
     *(ulong *)(lVar30 + 0x10) < *(ulong *)(lVar30 + 8) >> 7)) goto LAB_00103751;
  iVar24 = *piVar2;
  lVar20 = *(long *)(literal_context_lut + 0x78);
  *(long *)(lVar30 + 8) = *(long *)(lVar30 + 8) + 1;
  uVar36 = (ulong)((uint)(iVar24 * 0x1e35a7bd) >> 0x12);
  bVar16 = *(byte *)(lVar20 + uVar36 * 2);
  uVar38 = (ulong)bVar16;
  if (uVar38 == 0) goto LAB_00103751;
  bVar41 = true;
  iVar33 = 0;
  iVar24 = 0;
  if (uVar38 <= local_110) {
    uVar36 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar36 * 4);
    lVar20 = *(long *)(literal_context_lut + 0x58);
    pcVar14 = (char *)(uVar36 * uVar38 + *(long *)(lVar20 + 0xa8) +
                      (ulong)*(uint *)(lVar20 + 0x20 + uVar38 * 4));
    if (7 < bVar16) {
      uVar34 = (ulong)(bVar16 & 0xfffffff8);
      lVar22 = 0;
      uVar39 = 0;
LAB_0010381b:
      if (*(ulong *)(pcVar14 + uVar39 * 8) == *(ulong *)(piVar2 + uVar39 * 2))
      goto code_r0x00103828;
      uVar34 = *(ulong *)(piVar2 + uVar39 * 2) ^ *(ulong *)(pcVar14 + uVar39 * 8);
      uVar39 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
        }
      }
      uVar39 = (uVar39 >> 3 & 0x1fffffff) - lVar22;
      goto LAB_0010385a;
    }
    uVar34 = 0;
    goto LAB_00103949;
  }
LAB_0010372b:
  if (!bVar41) {
    *(long *)(lVar30 + 0x10) = *(long *)(lVar30 + 0x10) + 1;
  }
LAB_00103751:
  *(uint *)(lVar5 + lVar18 * 4) = (uint)uVar17;
  bVar41 = local_130 + 0xaf <= uVar40;
  local_d8 = uVar15;
  iVar24 = iVar25;
  if (bVar41) {
    local_120 = local_120 + 1;
    local_108 = local_100;
    local_138 = local_f8;
    local_130 = uVar40;
    local_d8 = uVar17;
    local_124 = iVar33;
    iVar24 = iVar25 + 1;
  }
  bVar6 = 2 < iVar25;
  uVar36 = uVar15 + 9;
  uVar31 = uVar31 - 1;
  uVar15 = local_d8;
  iVar25 = iVar24;
  if (!bVar41 || (bVar6 || uVar26 <= uVar36)) goto LAB_001039f6;
  goto LAB_00103435;
code_r0x00103828:
  uVar39 = uVar39 + 1;
  lVar22 = lVar22 + -8;
  if (bVar16 >> 3 == uVar39) goto code_r0x00103834;
  goto LAB_0010381b;
code_r0x00103834:
  pcVar14 = pcVar14 + -lVar22;
LAB_00103949:
  uVar13 = uVar38 & 7;
  uVar39 = uVar34;
  if ((bVar16 & 7) != 0) {
    uVar21 = uVar34 | uVar13;
    do {
      uVar39 = uVar34;
      if (*(char *)((long)piVar2 + uVar34) != *pcVar14) break;
      pcVar14 = pcVar14 + 1;
      uVar34 = uVar34 + 1;
      uVar13 = uVar13 - 1;
      uVar39 = uVar21;
    } while (uVar13 != 0);
  }
LAB_0010385a:
  bVar41 = true;
  iVar33 = iVar24;
  if (((uVar39 != 0) && (uVar38 < *(uint *)(literal_context_lut + 100) + uVar39)) &&
     (uVar36 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar38 - uVar39) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar38 - uVar39) * 4 << (*(byte *)(lVar20 + uVar38) & 0x3f)) + uVar23 + 1 + uVar36,
     uVar36 <= uVar19)) {
    iVar24 = 0x1f;
    if ((uint)uVar36 != 0) {
      for (; (uint)uVar36 >> iVar24 == 0; iVar24 = iVar24 + -1) {
      }
    }
    uVar38 = (uVar39 * 0x87 - (ulong)(uint)(iVar24 * 0x1e)) + 0x780;
    if (0x7e3 < uVar38) {
      iVar33 = (uint)bVar16 - (int)uVar39;
      bVar41 = false;
      uVar40 = uVar38;
      local_100 = uVar36;
      local_f8 = uVar39;
    }
  }
  goto LAB_0010372b;
LAB_001039f6:
  uVar15 = local_d8 + lVar4;
  if (uVar28 <= local_d8 + lVar4) {
    uVar15 = uVar28;
  }
  if (uVar15 < local_108) {
LAB_00103c03:
    uVar12 = local_108 + 0xf;
  }
  else {
    uVar12 = (ulong)*(int *)&(hasher->common).extra;
    uVar37 = 0;
    bVar41 = false;
    if (local_108 != uVar12) {
      uVar31 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      if (local_108 == uVar31) {
        uVar37 = 1;
      }
      else {
        uVar12 = (local_108 + 3) - uVar12;
        if (uVar12 < 7) {
          bVar16 = (byte)((int)uVar12 << 2);
          uVar37 = 0x9750468;
        }
        else {
          uVar31 = (local_108 + 3) - uVar31;
          if (6 < uVar31) {
            if (local_108 != (long)(int)(hasher->common).dict_num_lookups) {
              bVar41 = local_108 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
              uVar37 = 3;
              goto LAB_00103bff;
            }
            uVar37 = 2;
            goto LAB_00103bfd;
          }
          bVar16 = (byte)((int)uVar31 << 2);
          uVar37 = 0xfdb1ace;
        }
        uVar37 = uVar37 >> (bVar16 & 0x1f) & 0xf;
      }
LAB_00103bfd:
      bVar41 = false;
    }
LAB_00103bff:
    if (bVar41) goto LAB_00103c03;
    uVar12 = (ulong)uVar37;
  }
  if ((local_108 <= uVar15) && (uVar12 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
    *(int *)&(hasher->common).extra = (int)local_108;
  }
  uVar37 = (uint)local_120;
  *(uint *)local_e8 = uVar37;
  *(uint *)((long)local_e8 + 4) = local_124 << 0x19 | (uint)local_138;
  uVar15 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  if (uVar12 < uVar15) {
    *(short *)((long)local_e8 + 0xe) = (short)uVar12;
    uVar27 = 0;
  }
  else {
    bVar16 = (byte)*(int *)(literal_context_lut + 0x40);
    uVar12 = ((uVar12 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar16 & 0x3f))) - 0x10;
    uVar27 = 0x1f;
    if ((uint)uVar12 != 0) {
      for (; (uint)uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    uVar27 = (uVar27 ^ 0xffffffe0) + 0x1f;
    bVar41 = (uVar12 >> ((ulong)uVar27 & 0x3f) & 1) != 0;
    iVar25 = uVar27 - *(int *)(literal_context_lut + 0x40);
    *(ushort *)((long)local_e8 + 0xe) =
         (short)((uint)bVar41 + iVar25 * 2 + 0xfffe << (bVar16 & 0x3f)) +
         (short)uVar15 + (~(ushort)(-1 << (bVar16 & 0x1f)) & (ushort)uVar12) | (short)iVar25 * 0x400
    ;
    uVar27 = (uint)(uVar12 - ((ulong)bVar41 + 2 << ((byte)uVar27 & 0x3f)) >> (bVar16 & 0x3f));
  }
  *(uint *)(local_e8 + 1) = uVar27;
  if (5 < local_120) {
    if (local_120 < 0x82) {
      uVar37 = 0x1f;
      uVar27 = (uint)(local_120 - 2);
      if (uVar27 != 0) {
        for (; uVar27 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar37 = (int)(local_120 - 2 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar37 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_120 < 0x842) {
      uVar27 = 0x1f;
      if (uVar37 - 0x42 != 0) {
        for (; uVar37 - 0x42 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar37 = (uVar27 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar37 = 0x15;
      if (0x1841 < local_120) {
        uVar37 = (uint)(ushort)(0x17 - (local_120 < 0x5842));
      }
    }
  }
  uVar27 = local_124 + (uint)local_138;
  if (uVar27 < 10) {
    uVar10 = uVar27 - 2;
  }
  else if (uVar27 < 0x86) {
    uVar27 = uVar27 - 6;
    uVar10 = 0x1f;
    if (uVar27 != 0) {
      for (; uVar27 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar10 = (int)((ulong)(long)(int)uVar27 >> ((char)(uVar10 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar10 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar10 = 0x17;
    if (uVar27 < 0x846) {
      uVar10 = 0x1f;
      if (uVar27 - 0x46 != 0) {
        for (; uVar27 - 0x46 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = (uVar10 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar10;
  uVar9 = (uVar7 & 7) + ((ushort)uVar37 & 7) * 8;
  if ((((*(ushort *)((long)local_e8 + 0xe) & 0x3ff) == 0) && ((ushort)uVar37 < 8)) && (uVar7 < 0x10)
     ) {
    if (7 < uVar7) {
      uVar9 = uVar9 | 0x40;
    }
  }
  else {
    iVar25 = ((uVar37 & 0xffff) >> 3) * 3 + ((uVar10 & 0xffff) >> 3);
    uVar9 = uVar9 + ((ushort)(0x520d40 >> ((char)iVar25 * '\x02' & 0x1fU)) & 0xc0) +
                    (short)iVar25 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_e8 + 0xc) = uVar9;
  *num_commands = *num_commands + local_120;
  position = local_d8 + local_138;
  uVar15 = uVar11;
  if (position < uVar11) {
    uVar15 = position;
  }
  uVar12 = local_d8 + 2;
  if (local_108 < local_138 >> 2) {
    uVar31 = position + local_108 * -4;
    if (uVar31 < uVar12) {
      uVar31 = uVar12;
    }
    uVar12 = uVar31;
    if (uVar15 < uVar31) {
      uVar12 = uVar15;
    }
  }
  local_d8 = lVar35 + local_138 * 2 + local_d8;
  local_e8 = local_e8 + 2;
  if (uVar12 < uVar15) {
    do {
      *(uint *)(lVar5 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar12 & ringbuffer_mask)) *
                                              -0x42e1ca5843000000) >> 0x2f) + ((uint)uVar12 & 0x18)
                               & 0x1ffff) * 4) = (uint)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar15 != uVar12);
  }
  local_120 = 0;
LAB_00103eb3:
  uVar15 = position;
  if (uVar26 <= position + 8) goto LAB_00103f7d;
  goto LAB_00103074;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}